

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_function_prototype
          (CompilerMSL *this,SPIRFunction *func,Bitset *param_2)

{
  undefined8 type_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Types TVar4;
  Variant *pVVar5;
  TypedID<(spirv_cross::Types)2> *pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf0;
  char (*local_500) [16];
  char (*local_4e8) [16];
  string local_3f0;
  string local_3d0;
  byte local_3ad;
  VariableID local_3ac;
  undefined1 local_3a8 [3];
  bool arg_is_array_1;
  string local_388;
  byte local_361;
  undefined1 local_360 [7];
  bool arg_is_array;
  string local_340;
  string local_320;
  char *local_300;
  char *sampler_address_space;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  undefined1 local_254 [8];
  uint32_t i;
  MSLConstexprSampler *constexpr_sampler;
  undefined8 uStack_240;
  uint32_t planes;
  SPIRType *arg_type;
  undefined1 local_230 [7];
  bool is_dynamic_img_sampler;
  SPIRVariable *local_210;
  SPIRVariable *var_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_200;
  uint32_t name_id;
  Parameter *arg_1;
  Parameter *__end1;
  Parameter *__begin1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1;
  string local_1c0;
  undefined1 local_19c [8];
  Parameter arg;
  SPIRVariable *var;
  TypedID<(spirv_cross::Types)2> *v;
  TypedID<(spirv_cross::Types)2> *__end2_1;
  TypedID<(spirv_cross::Types)2> *__begin2_1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *__range2_1;
  TypedID *local_158;
  ID *initializer;
  SPIRVariable *ed_var;
  uint *puStack_140;
  uint var_id;
  uint *__end2;
  uint *__begin2;
  SmallVector<unsigned_int,_8UL> *__range2;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_120;
  string local_118;
  string local_f8;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78;
  SPIRType *local_58;
  SPIRType *type;
  undefined1 local_40 [8];
  string decl;
  Bitset *param_2_local;
  SPIRFunction *func_local;
  CompilerMSL *this_local;
  
  decl.field_2._8_8_ = param_2;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  if (uVar2 != uVar3) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_CompilerGLSL).local_variable_names,
              &(this->super_CompilerGLSL).resource_names);
  ::std::__cxx11::string::string((string *)local_40);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  (this->super_CompilerGLSL).processing_entry_point = uVar2 == uVar3;
  if (((this->super_CompilerGLSL).processing_entry_point & 1U) == 0) {
    CompilerGLSL::statement<char_const*&>(&this->super_CompilerGLSL,&force_inline);
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).field_0xc);
  local_58 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = VectorView<unsigned_int>::empty(&(local_58->array).super_VectorView<unsigned_int>);
  if ((bVar1) || (((this->msl_options).force_native_arrays & 1U) == 0)) {
    func_type_decl_abi_cxx11_(&local_78,this,local_58);
    ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    ::std::__cxx11::string::operator+=((string *)local_40,"void");
  }
  ::std::__cxx11::string::operator+=((string *)local_40," ");
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_98,this,(ulong)uVar2,1);
  ::std::__cxx11::string::operator+=((string *)local_40,local_98);
  ::std::__cxx11::string::~string(local_98);
  ::std::__cxx11::string::operator+=((string *)local_40,"(");
  bVar1 = VectorView<unsigned_int>::empty(&(local_58->array).super_VectorView<unsigned_int>);
  if ((!bVar1) && (((this->msl_options).force_native_arrays & 1U) != 0)) {
    ::std::__cxx11::string::operator+=((string *)local_40,"thread ");
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_b8,this,local_58,0);
    ::std::__cxx11::string::operator+=((string *)local_40,local_b8);
    ::std::__cxx11::string::~string(local_b8);
    ::std::__cxx11::string::operator+=((string *)local_40," (&spvReturnValue)");
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(local_d8,this,local_58,0);
    ::std::__cxx11::string::operator+=((string *)local_40,local_d8);
    ::std::__cxx11::string::~string(local_d8);
    bVar1 = VectorView<spirv_cross::SPIRFunction::Parameter>::empty
                      (&(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
    if (!bVar1) {
      ::std::__cxx11::string::operator+=((string *)local_40,", ");
    }
  }
  if (((this->super_CompilerGLSL).processing_entry_point & 1U) != 0) {
    if (((this->msl_options).argument_buffers & 1U) == 0) {
      bVar1 = VectorView<spirv_cross::SPIRFunction::Parameter>::empty
                        (&(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
      entry_point_args_classic_abi_cxx11_(&local_118,this,!bVar1);
      ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_118);
      ::std::__cxx11::string::~string((string *)&local_118);
    }
    else {
      bVar1 = VectorView<spirv_cross::SPIRFunction::Parameter>::empty
                        (&(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
      entry_point_args_argument_buffer_abi_cxx11_(&local_f8,this,!bVar1);
      ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_f8);
      ::std::__cxx11::string::~string((string *)&local_f8);
    }
    this_00 = &(this->super_CompilerGLSL).resource_names;
    local_120._M_cur =
         (__node_type *)
         ::std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(this_00);
    __range2 = (SmallVector<unsigned_int,_8UL> *)
               ::std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this_00);
    ::std::
    unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::insert<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
              ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this->super_CompilerGLSL).local_variable_names,
               (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )local_120._M_cur,
               (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )__range2);
    __begin2 = (uint *)&this->vars_needing_early_declaration;
    __end2 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin2);
    puStack_140 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin2);
    for (; __end2 != puStack_140; __end2 = __end2 + 1) {
      ed_var._4_4_ = *__end2;
      initializer = (ID *)Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,ed_var._4_4_);
      local_158 = (TypedID *)&((SPIRVariable *)initializer)->initializer;
      uVar2 = TypedID::operator_cast_to_unsigned_int(local_158);
      if (uVar2 == 0) {
        uVar2 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)((long)&__range2_1 + 4),uVar2);
        *(uint32_t *)local_158 = __range2_1._4_4_;
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int(local_158);
      pVVar5 = VectorView<spirv_cross::Variant>::operator[]
                         (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>,(ulong)uVar2);
      TVar4 = Variant::get_type(pVVar5);
      if (TVar4 == TypeNone) {
LAB_00371f04:
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(initializer + 6));
        __range2_1._3_1_ = 1;
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&__range2_1 + 3);
        Compiler::
        set<spirv_cross::SPIRExpression,char_const(&)[3],spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                  ((Compiler *)this,uVar2,(char (*) [3])0x5a454c,
                   (TypedID<(spirv_cross::Types)1> *)(initializer + 3),(bool *)in_R8);
      }
      else {
        uVar2 = TypedID::operator_cast_to_unsigned_int(local_158);
        pVVar5 = VectorView<spirv_cross::Variant>::operator[]
                           (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>,(ulong)uVar2);
        TVar4 = Variant::get_type(pVVar5);
        if (TVar4 == TypeExpression) goto LAB_00371f04;
      }
    }
    __end2_1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::begin
                         (&(func->local_variables).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>);
    pTVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::end
                       (&(func->local_variables).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>);
    for (; __end2_1 != pTVar6; __end2_1 = __end2_1 + 1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end2_1);
      arg._12_8_ = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
      if (((SPIRVariable *)arg._12_8_)->storage == StorageClassTaskPayloadWorkgroupEXT) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end2_1);
        CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,uVar2);
        local_19c._0_4_ = 0;
        TypedID<(spirv_cross::Types)1>::TypedID((TypedID<(spirv_cross::Types)1> *)local_19c);
        local_19c._4_4_ = 0;
        TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)(local_19c + 4));
        arg.type.id = 0;
        arg.id.id = 0;
        arg.read_count._0_1_ = 0;
        TypedID<(spirv_cross::Types)0>::operator=
                  ((TypedID<(spirv_cross::Types)0> *)(local_19c + 4),__end2_1);
        local_19c._0_4_ = *(uint32_t *)(arg._12_8_ + 0xc);
        arg.read_count._0_1_ = 1;
        argument_decl_abi_cxx11_((string *)&__range1,this,(Parameter *)local_19c);
        join<char_const(&)[3],std::__cxx11::string,char_const(&)[13]>
                  (&local_1c0,(spirv_cross *)0x5a8753,(char (*) [3])&__range1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " [[payload]]",(char (*) [13])in_R8);
        ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&__range1);
      }
    }
  }
  __begin1 = (Parameter *)&func->arguments;
  __end1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                     ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  arg_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                    ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  do {
    if (__end1 == arg_1) {
      ::std::__cxx11::string::operator+=((string *)local_40,")");
      CompilerGLSL::statement<std::__cxx11::string&>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      ::std::__cxx11::string::~string((string *)local_40);
      return;
    }
    pbStack_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__end1;
    var_1._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->id);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pbStack_200->field_0x4);
    local_210 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
    if (local_210 != (SPIRVariable *)0x0) {
      if ((((pbStack_200->field_2)._M_local_buf[0] & 1U) != 0) &&
         (uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_210->basevariable),
         uVar2 != 0)) {
        var_1._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_210->basevariable);
      }
      local_210->parameter = (Parameter *)pbStack_200;
    }
    CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,var_1._4_4_);
    argument_decl_abi_cxx11_((string *)local_230,this,(Parameter *)pbStack_200);
    ::std::__cxx11::string::operator+=((string *)local_40,(string *)local_230);
    ::std::__cxx11::string::~string((string *)local_230);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pbStack_200->field_0x4);
    arg_type._7_1_ =
         Compiler::has_extended_decoration
                   ((Compiler *)this,uVar2,SPIRVCrossDecorationDynamicImageSampler);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)pbStack_200);
    uStack_240 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    if ((((SPIRType *)uStack_240)->basetype == SampledImage) && ((arg_type._7_1_ & 1) == 0)) {
      constexpr_sampler._4_4_ = 1;
      register0x00000000 = find_constexpr_sampler(this,var_1._4_4_);
      if ((register0x00000000 != (MSLConstexprSampler *)0x0) &&
         ((register0x00000000->ycbcr_conversion_enable & 1U) != 0)) {
        constexpr_sampler._4_4_ = register0x00000000->planes;
      }
      for (local_254._0_4_ = 1; (uint)local_254._0_4_ < constexpr_sampler._4_4_;
          local_254._0_4_ = local_254._0_4_ + 1) {
        argument_decl_abi_cxx11_(&local_298,this,(Parameter *)pbStack_200);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_254;
        join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                  (&local_278,(spirv_cross *)0x5a8753,(char (*) [3])&local_298,
                   &this->plane_name_suffix,in_R8,(uint *)in_R9);
        ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_278);
        ::std::__cxx11::string::~string((string *)&local_278);
        ::std::__cxx11::string::~string((string *)&local_298);
      }
      if (*(Dim *)(uStack_240 + 0x10c) != Buffer) {
        bVar1 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)(uStack_240 + 0x20));
        if (bVar1) {
LAB_00372566:
          type_00 = uStack_240;
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pbStack_200->field_0x4);
          sampler_type_abi_cxx11_(&local_2d8,this,(SPIRType *)type_00,uVar2,false);
          to_sampler_expression_abi_cxx11_((string *)&sampler_address_space,this,var_1._4_4_);
          in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &sampler_address_space;
          join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                    (&local_2b8,(spirv_cross *)0x5a8753,(char (*) [3])&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x57fa85,
                     (char (*) [2])in_R8,in_R9);
          ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_2b8);
          ::std::__cxx11::string::~string((string *)&local_2b8);
          ::std::__cxx11::string::~string((string *)&sampler_address_space);
          ::std::__cxx11::string::~string((string *)&local_2d8);
        }
        else {
          if (local_210 == (SPIRVariable *)0x0) {
            bVar1 = Compiler::is_runtime_size_array((SPIRType *)uStack_240);
            if (bVar1) goto LAB_00372566;
          }
          else {
            bVar1 = is_var_runtime_size_array(this,local_210);
            if (bVar1) goto LAB_00372566;
          }
          local_300 = descriptor_address_space
                                (this,var_1._4_4_,StorageClassUniformConstant,"thread const");
          sampler_type_abi_cxx11_(&local_340,this,(SPIRType *)uStack_240,var_1._4_4_,false);
          to_sampler_expression_abi_cxx11_((string *)local_360,this,var_1._4_4_);
          in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a64ad;
          in_R8 = &local_340;
          join<char_const(&)[3],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                    (&local_320,(spirv_cross *)0x5a8753,(char (*) [3])&local_300,(char **)0x57fa85,
                     (char (*) [2])in_R8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a64ad,
                     (char (*) [3])local_360,in_stack_fffffffffffffaf0);
          ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_320);
          ::std::__cxx11::string::~string((string *)&local_320);
          ::std::__cxx11::string::~string((string *)local_360);
          ::std::__cxx11::string::~string((string *)&local_340);
        }
      }
    }
    if ((((((this->msl_options).swizzle_texture_samples & 1U) != 0) &&
         ((this->has_sampled_images & 1U) != 0)) &&
        (bVar1 = Compiler::is_sampled_image_type((Compiler *)this,(SPIRType *)uStack_240), bVar1))
       && ((arg_type._7_1_ & 1) == 0)) {
      bVar1 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)(uStack_240 + 0x20));
      local_361 = (bVar1 ^ 0xffU) & 1;
      if (local_361 == 0) {
        local_4e8 = (char (*) [16])0x5a64ad;
      }
      else {
        local_4e8 = (char (*) [16])0x5abafd;
      }
      to_swizzle_expression_abi_cxx11_((string *)local_3a8,this,var_1._4_4_);
      join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                (&local_388,(spirv_cross *)", constant uint",local_4e8,(char (*) [3])local_3a8,in_R8
                );
      ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_388);
      ::std::__cxx11::string::~string((string *)&local_388);
      ::std::__cxx11::string::~string((string *)local_3a8);
    }
    TypedID<(spirv_cross::Types)2>::TypedID(&local_3ac,var_1._4_4_);
    bVar1 = buffer_requires_array_length(this,local_3ac);
    if (bVar1) {
      bVar1 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)(uStack_240 + 0x20));
      local_3ad = (bVar1 ^ 0xffU) & 1;
      if (local_3ad == 0) {
        local_500 = (char (*) [16])0x5a64ad;
      }
      else {
        local_500 = (char (*) [16])0x5abafd;
      }
      to_buffer_size_expression_abi_cxx11_(&local_3f0,this,var_1._4_4_);
      join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                (&local_3d0,(spirv_cross *)", constant uint",local_500,(char (*) [3])&local_3f0,
                 in_R8);
      ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_3d0);
      ::std::__cxx11::string::~string((string *)&local_3d0);
      ::std::__cxx11::string::~string((string *)&local_3f0);
    }
    in_stack_fffffffffffffaf0 = pbStack_200;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             VectorView<spirv_cross::SPIRFunction::Parameter>::back
                       (&(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
    if (in_stack_fffffffffffffaf0 != pbVar7) {
      ::std::__cxx11::string::operator+=((string *)local_40,", ");
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::emit_function_prototype(SPIRFunction &func, const Bitset &)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	local_variable_names = resource_names;
	string decl;

	processing_entry_point = func.self == ir.default_entry_point;

	// Metal helper functions must be static force-inline otherwise they will cause problems when linked together in a single Metallib.
	if (!processing_entry_point)
		statement(force_inline);

	auto &type = get<SPIRType>(func.return_type);

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// We cannot return native arrays in MSL, so "return" through an out variable.
		decl += "void";
	}
	else
	{
		decl += func_type_decl(type);
	}

	decl += " ";
	decl += to_name(func.self);
	decl += "(";

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// Fake arrays returns by writing to an out array instead.
		decl += "thread ";
		decl += type_to_glsl(type);
		decl += " (&spvReturnValue)";
		decl += type_to_array_glsl(type, 0);
		if (!func.arguments.empty())
			decl += ", ";
	}

	if (processing_entry_point)
	{
		if (msl_options.argument_buffers)
			decl += entry_point_args_argument_buffer(!func.arguments.empty());
		else
			decl += entry_point_args_classic(!func.arguments.empty());

		// append entry point args to avoid conflicts in local variable names.
		local_variable_names.insert(resource_names.begin(), resource_names.end());

		// If entry point function has variables that require early declaration,
		// ensure they each have an empty initializer, creating one if needed.
		// This is done at this late stage because the initialization expression
		// is cleared after each compilation pass.
		for (auto var_id : vars_needing_early_declaration)
		{
			auto &ed_var = get<SPIRVariable>(var_id);
			ID &initializer = ed_var.initializer;
			if (!initializer)
				initializer = ir.increase_bound_by(1);

			// Do not override proper initializers.
			if (ir.ids[initializer].get_type() == TypeNone || ir.ids[initializer].get_type() == TypeExpression)
				set<SPIRExpression>(ed_var.initializer, "{}", ed_var.basetype, true);
		}

		// add `taskPayloadSharedEXT` variable to entry-point arguments
		for (auto &v : func.local_variables)
		{
			auto &var = get<SPIRVariable>(v);
			if (var.storage != StorageClassTaskPayloadWorkgroupEXT)
				continue;

			add_local_variable_name(v);
			SPIRFunction::Parameter arg = {};
			arg.id = v;
			arg.type = var.basetype;
			arg.alias_global_variable = true;
			decl += join(", ", argument_decl(arg), " [[payload]]");
		}
	}

	for (auto &arg : func.arguments)
	{
		uint32_t name_id = arg.id;

		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
		{
			// If we need to modify the name of the variable, make sure we modify the original variable.
			// Our alias is just a shadow variable.
			if (arg.alias_global_variable && var->basevariable)
				name_id = var->basevariable;

			var->parameter = &arg; // Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		}

		add_local_variable_name(name_id);

		decl += argument_decl(arg);

		bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);

		auto &arg_type = get<SPIRType>(arg.type);
		if (arg_type.basetype == SPIRType::SampledImage && !is_dynamic_img_sampler)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (auto *constexpr_sampler = find_constexpr_sampler(name_id))
				if (constexpr_sampler->ycbcr_conversion_enable)
					planes = constexpr_sampler->planes;
			for (uint32_t i = 1; i < planes; i++)
				decl += join(", ", argument_decl(arg), plane_name_suffix, i);

			// Manufacture automatic sampler arg for SampledImage texture
			if (arg_type.image.dim != DimBuffer)
			{
				if (arg_type.array.empty() || (var ? is_var_runtime_size_array(*var) : is_runtime_size_array(arg_type)))
				{
					decl += join(", ", sampler_type(arg_type, arg.id, false), " ", to_sampler_expression(name_id));
				}
				else
				{
					const char *sampler_address_space =
							descriptor_address_space(name_id,
							                         StorageClassUniformConstant,
							                         "thread const");
					decl += join(", ", sampler_address_space, " ", sampler_type(arg_type, name_id, false), "& ",
					             to_sampler_expression(name_id));
				}
			}
		}

		// Manufacture automatic swizzle arg.
		if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(arg_type) &&
		    !is_dynamic_img_sampler)
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_swizzle_expression(name_id));
		}

		if (buffer_requires_array_length(name_id))
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_buffer_size_expression(name_id));
		}

		if (&arg != &func.arguments.back())
			decl += ", ";
	}

	decl += ")";
	statement(decl);
}